

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

int __thiscall
kratos::RawStringStmt::clone
          (RawStringStmt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  element_type *this_00;
  RawStringStmt *local_38;
  shared_ptr<kratos::RawStringStmt> stmt;
  
  local_38 = (RawStringStmt *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::RawStringStmt,std::allocator<kratos::RawStringStmt>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt,&local_38,
             (allocator<kratos::RawStringStmt> *)
             ((long)&stmt.super___shared_ptr<kratos::RawStringStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(__fn + 0xc0));
  std::__shared_ptr<kratos::RawStringStmt,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::RawStringStmt,kratos::RawStringStmt>
            ((__shared_ptr<kratos::RawStringStmt,(__gnu_cxx::_Lock_policy)2> *)&local_38,local_38);
  this_00 = stmt.super___shared_ptr<kratos::RawStringStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (stmt.super___shared_ptr<kratos::RawStringStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar1 = &((stmt.super___shared_ptr<kratos::RawStringStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->super_Stmt).super_IRNode.fn_name_ln;
      *(int *)&(pvVar1->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar1 = &((stmt.super___shared_ptr<kratos::RawStringStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->super_Stmt).super_IRNode.fn_name_ln;
      *(int *)&(pvVar1->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  (local_38->super_Stmt).super_IRNode.verilog_ln = *(uint32_t *)(__fn + 0x20);
  std::__cxx11::string::_M_assign((string *)&(local_38->super_Stmt).super_IRNode.comment);
  if (this_00 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)local_38;
  (this->super_Stmt).super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Stmt).super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)stmt.super___shared_ptr<kratos::RawStringStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> RawStringStmt::clone() const {
    auto stmt = std::make_shared<RawStringStmt>(stmts_);
    copy_meta(stmt);
    return stmt;
}